

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void MIR_output_op(MIR_context_t ctx,FILE *f,MIR_op_t op,MIR_func_t func)

{
  float var;
  MIR_label_t label;
  MIR_alias_t alias;
  code *pcVar1;
  char *pcVar2;
  MIR_reg_t MVar3;
  MIR_reg_t no_reg;
  MIR_func_t func_local;
  FILE *f_local;
  MIR_context_t ctx_local;
  
  var = op.u._0_4_;
  label = op.u._0_8_;
  switch(op._8_1_) {
  case (BADTYPE)0x1:
    output_reg(ctx,f,func,(MIR_reg_t)var);
    break;
  case (BADTYPE)0x2:
    output_var(ctx,f,func,(MIR_reg_t)var);
    break;
  case (BADTYPE)0x3:
    fprintf((FILE *)f,"%ld",label);
    break;
  case (BADTYPE)0x4:
    fprintf((FILE *)f,"%lu",label);
    break;
  case (BADTYPE)0x5:
    fprintf((FILE *)f,"%.*ef",(double)var,0x18);
    break;
  case (BADTYPE)0x6:
    fprintf((FILE *)f,"%.*e",label,0x35);
    break;
  case (BADTYPE)0x7:
    fprintf((FILE *)f,"%.*LeL",0x40);
    break;
  case (BADTYPE)0x8:
    if ((label->insn_link).prev != (MIR_insn_t)func->func_item->module) {
      fprintf((FILE *)f,"%s.",(((label->insn_link).prev)->insn_link).prev);
    }
    pcVar2 = MIR_item_name(ctx,(MIR_item_t_conflict)label);
    fprintf((FILE *)f,"%s",pcVar2);
    break;
  case (BADTYPE)0x9:
    MIR_output_str(ctx,f,op.u._0_16_);
    break;
  case (BADTYPE)0xa:
  case (BADTYPE)0xb:
    MVar3 = 0xffffffff;
    if (op._8_1_ == '\n') {
      MVar3 = 0;
    }
    output_type(ctx,f,(uint)(byte)op.u.reg._0_1_);
    fprintf((FILE *)f,":");
    if ((op.u.mem.disp != 0) || ((op.u.mem.base == MVar3 && (op.u.mem.index == MVar3)))) {
      output_disp(f,op.u.mem.disp);
    }
    if ((op.u.mem.base != MVar3) || (op.u.mem.index != MVar3)) {
      fprintf((FILE *)f,"(");
      if (op.u.mem.base != MVar3) {
        pcVar1 = output_var;
        if ((op._8_2_ & 0xff) == 10) {
          pcVar1 = output_reg;
        }
        (*pcVar1)(ctx,f,func,op.u.mem.base);
      }
      if (op.u.mem.index != MVar3) {
        fprintf((FILE *)f,", ");
        pcVar1 = output_var;
        if ((op._8_2_ & 0xff) == 10) {
          pcVar1 = output_reg;
        }
        (*pcVar1)(ctx,f,func,op.u.mem.index);
        if (op.u.mem.scale != '\x01') {
          fprintf((FILE *)f,", ");
          output_scale(f,(uint)op.u.mem.scale);
        }
      }
      fprintf((FILE *)f,")");
    }
    alias = op.u._8_4_;
    if ((op.u.mem.alias != 0) || (alias != 0)) {
      fprintf((FILE *)f,":");
      if (op.u.mem.alias != 0) {
        pcVar2 = MIR_alias_name(ctx,op.u.mem.alias);
        fprintf((FILE *)f,"%s",pcVar2);
      }
      if (alias != 0) {
        pcVar2 = MIR_alias_name(ctx,alias);
        fprintf((FILE *)f,":%s",pcVar2);
      }
    }
    break;
  case (BADTYPE)0xc:
    output_label(ctx,f,func,label);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0xb95,"void MIR_output_op(MIR_context_t, FILE *, MIR_op_t, MIR_func_t)");
  }
  return;
}

Assistant:

void MIR_output_op (MIR_context_t ctx, FILE *f, MIR_op_t op, MIR_func_t func) {
  switch (op.mode) {
  case MIR_OP_REG: output_reg (ctx, f, func, op.u.reg); break;
  case MIR_OP_VAR: output_var (ctx, f, func, op.u.var); break;
  case MIR_OP_INT: fprintf (f, "%" PRId64, op.u.i); break;
  case MIR_OP_UINT: fprintf (f, "%" PRIu64, op.u.u); break;
  case MIR_OP_FLOAT: fprintf (f, "%.*ef", FLT_MANT_DIG, op.u.f); break;
  case MIR_OP_DOUBLE: fprintf (f, "%.*e", DBL_MANT_DIG, op.u.d); break;
  case MIR_OP_LDOUBLE: fprintf (f, "%.*LeL", LDBL_MANT_DIG, op.u.ld); break;
  case MIR_OP_MEM:
  case MIR_OP_VAR_MEM: {
    MIR_reg_t no_reg = op.mode == MIR_OP_MEM ? 0 : MIR_NON_VAR;

    output_type (ctx, f, op.u.mem.type);
    fprintf (f, ":");
    if (op.u.mem.disp != 0 || (op.u.mem.base == no_reg && op.u.mem.index == no_reg))
      output_disp (f, op.u.mem.disp);
    if (op.u.mem.base != no_reg || op.u.mem.index != no_reg) {
      fprintf (f, "(");
      if (op.u.mem.base != no_reg)
        (op.mode == MIR_OP_MEM ? output_reg : output_var) (ctx, f, func, op.u.mem.base);
      if (op.u.mem.index != no_reg) {
        fprintf (f, ", ");
        (op.mode == MIR_OP_MEM ? output_reg : output_var) (ctx, f, func, op.u.mem.index);
        if (op.u.mem.scale != 1) {
          fprintf (f, ", ");
          output_scale (f, op.u.mem.scale);
        }
      }
      fprintf (f, ")");
    }
    if (op.u.mem.alias != 0 || op.u.mem.nonalias != 0) {
      fprintf (f, ":");
      if (op.u.mem.alias != 0) fprintf (f, "%s", MIR_alias_name (ctx, op.u.mem.alias));
      if (op.u.mem.nonalias != 0) fprintf (f, ":%s", MIR_alias_name (ctx, op.u.mem.nonalias));
    }
    break;
  }
  case MIR_OP_REF:
    if (op.u.ref->module != func->func_item->module) fprintf (f, "%s.", op.u.ref->module->name);
    fprintf (f, "%s", MIR_item_name (ctx, op.u.ref));
    break;
  case MIR_OP_STR: MIR_output_str (ctx, f, op.u.str); break;
  case MIR_OP_LABEL: output_label (ctx, f, func, op.u.label); break;
  default: mir_assert (FALSE);
  }
}